

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.hpp
# Opt level: O2

void __thiscall
vkt::pipeline::ColorFragmentShader::ColorFragmentShader
          (ColorFragmentShader *this,TextureFormat *colorFormat,TextureFormat *depthStencilFormat)

{
  TextureFormat TVar1;
  pointer pVVar2;
  TextureChannelClass TVar3;
  GenericVecType GVar4;
  
  rr::FragmentShader::FragmentShader(&this->super_FragmentShader,2,1);
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_00bfa7e0;
  TVar1 = *colorFormat;
  this->m_colorFormat = TVar1;
  this->m_depthStencilFormat = *depthStencilFormat;
  TVar3 = tcu::getTextureChannelClass(TVar1.type);
  pVVar2 = (this->super_FragmentShader).m_inputs.
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar2->type = GENERICVECTYPE_FLOAT;
  pVVar2[1].type = GENERICVECTYPE_FLOAT;
  GVar4 = (GenericVecType)(TVar3 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
  if (TVar3 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    GVar4 = GENERICVECTYPE_INT32;
  }
  ((this->super_FragmentShader).m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GVar4;
  return;
}

Assistant:

ColorFragmentShader (const tcu::TextureFormat& colorFormat,
						 const tcu::TextureFormat& depthStencilFormat)
		: rr::FragmentShader	(2, 1)
		, m_colorFormat			(colorFormat)
		, m_depthStencilFormat	(depthStencilFormat)
	{
		const tcu::TextureChannelClass channelClass = tcu::getTextureChannelClass(m_colorFormat.type);

		m_inputs[0].type	= rr::GENERICVECTYPE_FLOAT;
		m_inputs[1].type	= rr::GENERICVECTYPE_FLOAT;
		m_outputs[0].type	= (channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)? rr::GENERICVECTYPE_INT32 :
							  (channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)? rr::GENERICVECTYPE_UINT32
							  : rr::GENERICVECTYPE_FLOAT;
	}